

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

void __thiscall Moc::generate(Moc *this,FILE *out,FILE *jsonOutput)

{
  QByteArray *pQVar1;
  long lVar2;
  PropertyDef *pPVar3;
  long lVar4;
  Data *pDVar5;
  Moc *data;
  ClassDef *pCVar6;
  bool bVar7;
  bool bVar8;
  ClassDef *pCVar9;
  long lVar10;
  qsizetype qVar11;
  iterator classDef;
  iterator iVar12;
  FILE *pFVar14;
  char *pcVar15;
  ClassDef *cdef;
  QByteArray *pQVar16;
  ClassDef *pCVar17;
  long lVar18;
  QByteArray *pQVar19;
  long in_FS_OFFSET;
  QLatin1StringView key;
  QLatin1StringView s;
  QLatin1StringView key_00;
  QLatin1StringView key_01;
  QByteArrayView QVar20;
  QByteArrayView haystack;
  QJsonArray classesJsonFormatted;
  QJsonObject mocData;
  QArrayDataPointer<QByteArray> local_108;
  Generator generator;
  QJsonDocument jsonDoc;
  Generator *local_48;
  char *pcVar13;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  QVar20 = strippedFileName(this);
  pcVar13 = QVar20.m_data;
  fprintf((FILE *)out,
          "/****************************************************************************\n** Meta object code from reading C++ file \'%s\'\n**\n"
         );
  fprintf((FILE *)out,"** Created by: The Qt Meta Object Compiler version %d (Qt %s)\n**\n",0x45,
          "6.10.0");
  fwrite("** WARNING! All changes made in this file will be lost!\n*****************************************************************************/\n\n"
         ,0x88,1,(FILE *)out);
  if (this->noInclude == false) {
    pQVar1 = &this->includePath;
    lVar18 = (this->includePath).d.size;
    if ((lVar18 != 0) && ((this->includePath).d.ptr[lVar18 + -1] != '/')) {
      QByteArray::append(pQVar1,'/');
    }
    lVar18 = (this->includeFiles).d.size;
    if (lVar18 != 0) {
      pQVar19 = (this->includeFiles).d.ptr;
      pQVar16 = pQVar19 + lVar18;
      do {
        generator.parser = (Moc *)(pQVar19->d).d;
        generator.out = (FILE *)(pQVar19->d).ptr;
        generator.cdef = (ClassDef *)(pQVar19->d).size;
        if (generator.parser != (Moc *)0x0) {
          LOCK();
          ((__atomic_base<int> *)&((generator.parser)->super_Parser).symbols.d.d)->_M_i =
               ((__atomic_base<int> *)&((generator.parser)->super_Parser).symbols.d.d)->_M_i + 1;
          UNLOCK();
        }
        if (((generator.cdef != (ClassDef *)0x0) && (*generator.out != (FILE)0x22)) &&
           (*generator.out != (FILE)0x3c)) {
          if ((this->includePath).d.size != 0) {
            local_108.d = (Data *)0x182623;
            bVar7 = operator!=(pQVar1,(char **)&local_108);
            if (bVar7) {
              QByteArray::prepend((QByteArray *)&generator,pQVar1);
            }
          }
          jsonDoc.d._M_t.
          super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
          _M_t.
          super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
          .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl._0_1_ = '\"';
          local_48 = &generator;
          QStringBuilder<QStringBuilder<char,_QByteArray_&>,_char>::convertTo<QByteArray>
                    ((QByteArray *)&local_108,
                     (QStringBuilder<QStringBuilder<char,_QByteArray_&>,_char> *)&jsonDoc);
          pFVar14 = generator.out;
          data = generator.parser;
          qVar11 = local_108.size;
          pDVar5 = local_108.d;
          local_108.d = (Data *)generator.parser;
          generator.parser = (Moc *)pDVar5;
          generator.out = (FILE *)local_108.ptr;
          local_108.ptr = (QByteArray *)pFVar14;
          local_108.size = (qsizetype)generator.cdef;
          generator.cdef = (ClassDef *)qVar11;
          if (data != (Moc *)0x0) {
            LOCK();
            *(int *)&(data->super_Parser).symbols.d.d =
                 *(int *)&(data->super_Parser).symbols.d.d + -1;
            UNLOCK();
            if (*(int *)&(data->super_Parser).symbols.d.d == 0) {
              QArrayData::deallocate((QArrayData *)data,1,0x10);
            }
          }
        }
        pFVar14 = generator.out;
        if (generator.out == (FILE *)0x0) {
          pFVar14 = (FILE *)"";
        }
        fprintf((FILE *)out,"#include %s\n",pFVar14);
        if (generator.parser != (Moc *)0x0) {
          LOCK();
          *(int *)&((generator.parser)->super_Parser).symbols.d.d =
               *(int *)&((generator.parser)->super_Parser).symbols.d.d + -1;
          UNLOCK();
          if (*(int *)&((generator.parser)->super_Parser).symbols.d.d == 0) {
            QArrayData::deallocate((QArrayData *)generator.parser,1,0x10);
          }
        }
        pQVar19 = pQVar19 + 1;
      } while (pQVar19 != pQVar16);
    }
  }
  if ((this->classList).d.size != 0) {
    generator.parser = (Moc *)anon_var_dwarf_3f2c7;
    bVar7 = operator==((QByteArray *)(this->classList).d.ptr,(char **)&generator);
    if (bVar7) {
      fwrite("#include <QtCore/qobject.h>\n",0x1c,1,(FILE *)out);
    }
  }
  fwrite("#include <QtCore/qmetatype.h>\n",0x1e,1,(FILE *)out);
  if (this->mustIncludeQPluginH == true) {
    fwrite("#include <QtCore/qplugin.h>\n",0x1c,1,(FILE *)out);
  }
  local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_108.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  if (requiredQtContainers(QList<ClassDef>const&)::candidates == '\0') {
    generate();
  }
  local_108.d = (Data *)0x0;
  local_108.ptr = (QByteArray *)0x0;
  local_108.size = 0;
  QList<QByteArray>::reserve
            ((QList<QByteArray> *)&local_108,
             requiredQtContainers(QList<ClassDef>const&)::candidates._16_8_);
  if (requiredQtContainers(QList<ClassDef>const&)::candidates._16_8_ != 0) {
    pQVar1 = (QByteArray *)
             (requiredQtContainers(QList<ClassDef>const&)::candidates._8_8_ +
             requiredQtContainers(QList<ClassDef>const&)::candidates._16_8_ * 0x18);
    bVar7 = false;
    pQVar16 = (QByteArray *)requiredQtContainers(QList<ClassDef>const&)::candidates._8_8_;
    do {
      generator.cdef = (ClassDef *)&DAT_aaaaaaaaaaaaaaaa;
      generator.parser = (Moc *)&DAT_aaaaaaaaaaaaaaaa;
      generator.out = (FILE *)&DAT_aaaaaaaaaaaaaaaa;
      local_48._0_1_ = '<';
      jsonDoc.d._M_t.
      super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
      super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
      super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
           (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
           (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)pQVar16;
      QStringBuilder<const_QByteArray_&,_char>::convertTo<QByteArray>
                ((QByteArray *)&generator,(QStringBuilder<const_QByteArray_&,_char> *)&jsonDoc);
      pCVar6 = generator.cdef;
      pFVar14 = generator.out;
      lVar18 = (this->classList).d.size;
      if (lVar18 != 0) {
        pCVar17 = (this->classList).d.ptr;
        pCVar9 = pCVar17 + lVar18;
        do {
          lVar18 = (pCVar17->propertyList).d.size;
          if (lVar18 != 0) {
            pPVar3 = (pCVar17->propertyList).d.ptr;
            lVar18 = lVar18 * 0x158;
            lVar10 = 0;
            do {
              bVar7 = (bool)(bVar7 | *(long *)((long)&(pPVar3->bind).d.size + lVar10) != 0);
              lVar10 = lVar10 + 0x158;
            } while (lVar18 - lVar10 != 0);
            lVar10 = 0;
            do {
              QVar20.m_data = (storage_type *)pFVar14;
              QVar20.m_size = (qsizetype)pCVar6;
              haystack.m_data = *(storage_type **)((long)&(pPVar3->type).d.ptr + lVar10);
              haystack.m_size = *(qsizetype *)((long)&(pPVar3->type).d.size + lVar10);
              qVar11 = QtPrivate::findByteArray(haystack,0,QVar20);
              if (qVar11 != -1) goto LAB_0012baad;
              lVar10 = lVar10 + 0x158;
            } while (lVar18 - lVar10 != 0);
          }
          bVar8 = any_arg_contains((QList<FunctionDef> *)(pCVar17->slotList).d.ptr,
                                   (QByteArray *)(pCVar17->slotList).d.size);
          if (((bVar8) ||
              (bVar8 = any_arg_contains((QList<FunctionDef> *)(pCVar17->signalList).d.ptr,
                                        (QByteArray *)(pCVar17->signalList).d.size), bVar8)) ||
             (bVar8 = any_arg_contains((QList<FunctionDef> *)(pCVar17->methodList).d.ptr,
                                       (QByteArray *)(pCVar17->methodList).d.size), bVar8)) {
LAB_0012baad:
            QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
                      ((QMovableArrayOps<QByteArray> *)&local_108,local_108.size,pQVar16);
            QList<QByteArray>::end((QList<QByteArray> *)&local_108);
            break;
          }
          pCVar17 = pCVar17 + 1;
        } while (pCVar17 != pCVar9);
      }
      if (generator.parser != (Moc *)0x0) {
        LOCK();
        *(int *)&((generator.parser)->super_Parser).symbols.d.d =
             *(int *)&((generator.parser)->super_Parser).symbols.d.d + -1;
        UNLOCK();
        if (*(int *)&((generator.parser)->super_Parser).symbols.d.d == 0) {
          QArrayData::deallocate((QArrayData *)generator.parser,1,0x10);
        }
      }
      pQVar16 = pQVar16 + 1;
    } while (pQVar16 != pQVar1);
    if (bVar7) {
      QByteArray::QByteArray((QByteArray *)&generator,"QProperty",-1);
      QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                ((QMovableArrayOps<QByteArray> *)&local_108,local_108.size,(QByteArray *)&generator)
      ;
      QList<QByteArray>::end((QList<QByteArray> *)&local_108);
      if (generator.parser != (Moc *)0x0) {
        LOCK();
        *(int *)&((generator.parser)->super_Parser).symbols.d.d =
             *(int *)&((generator.parser)->super_Parser).symbols.d.d + -1;
        UNLOCK();
        if (*(int *)&((generator.parser)->super_Parser).symbols.d.d == 0) {
          QArrayData::deallocate((QArrayData *)generator.parser,1,0x10);
        }
      }
    }
  }
  pQVar1 = local_108.ptr;
  if (local_108.size != 0) {
    lVar18 = local_108.size * 0x18;
    lVar10 = 0;
    do {
      pcVar15 = *(char **)((long)&(pQVar1->d).ptr + lVar10);
      if (pcVar15 == (char *)0x0) {
        pcVar15 = "";
      }
      fprintf((FILE *)out,"#include <QtCore/%s>\n",pcVar15);
      lVar10 = lVar10 + 0x18;
    } while (lVar18 != lVar10);
  }
  fwrite("\n#include <QtCore/qtmochelpers.h>\n",0x22,1,(FILE *)out);
  fwrite("\n#include <memory>\n\n",0x14,1,(FILE *)out);
  fwrite("\n#include <QtCore/qxptype_traits.h>\n",0x24,1,(FILE *)out);
  fprintf((FILE *)out,
          "#if !defined(Q_MOC_OUTPUT_REVISION)\n#error \"The header file \'%s\' doesn\'t include <QObject>.\"\n"
          ,pcVar13);
  fprintf((FILE *)out,"#elif Q_MOC_OUTPUT_REVISION != %d\n",0x45);
  fprintf((FILE *)out,
          "#error \"This file was generated using the moc from %s. It\"\n#error \"cannot be used with the include files from this version of Qt.\"\n#error \"(The moc has changed too much.)\"\n"
          ,"6.10.0");
  fwrite("#endif\n\n",8,1,(FILE *)out);
  fwrite("#ifndef Q_CONSTINIT\n#define Q_CONSTINIT\n#endif\n\n",0x30,1,(FILE *)out);
  fwrite("QT_WARNING_PUSH\n",0x10,1,(FILE *)out);
  fwrite("QT_WARNING_DISABLE_DEPRECATED\n",0x1e,1,(FILE *)out);
  fwrite("QT_WARNING_DISABLE_GCC(\"-Wuseless-cast\")\n",0x29,1,(FILE *)out);
  fputs("",(FILE *)out);
  classDef = QList<ClassDef>::begin(&this->classList);
  iVar12 = QList<ClassDef>::end(&this->classList);
  if (classDef.i != iVar12.i) {
    do {
      memset(&generator,0xaa,0x90);
      Generator::Generator
                (&generator,this,classDef.i,&this->metaTypes,&this->knownQObjectClasses,
                 &this->knownGadgets,out,this->requireCompleteTypes);
      Generator::generateCode(&generator);
      if (0x7ffffffe < (ulong)generator.strings.d.size) {
        Parser::error(&this->super_Parser,
                      "internal limit exceeded: number of parsed strings is too big.");
      }
      QHash<QByteArray,_QByteArray>::~QHash(&generator.knownGadgets);
      QHash<QByteArray,_QByteArray>::~QHash(&generator.knownQObjectClasses);
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&generator.metaTypes.d);
      if (generator.purestSuperClass.d.d != (Data *)0x0) {
        LOCK();
        ((generator.purestSuperClass.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i = ((generator.purestSuperClass.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((generator.purestSuperClass.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(generator.purestSuperClass.d.d)->super_QArrayData,1,0x10);
        }
      }
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&generator.strings.d);
      if (generator.meta_data.d.d != (Data *)0x0) {
        LOCK();
        ((generator.meta_data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((generator.meta_data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((generator.meta_data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(generator.meta_data.d.d)->super_QArrayData,4,0x10);
        }
      }
      classDef.i = classDef.i + 1;
    } while (classDef.i != iVar12.i);
  }
  fputs("",(FILE *)out);
  fwrite("QT_WARNING_POP\n",0xf,1,(FILE *)out);
  if (jsonOutput != (FILE *)0x0) {
    mocData.o.d.ptr = (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject(&mocData);
    QJsonValue::QJsonValue((QJsonValue *)&generator,0x45);
    key.m_size = 0xe;
    key.m_data = "outputRevision";
    _jsonDoc = (QStringBuilder<const_QByteArray_&,_char>)QJsonObject::operator[](&mocData,key);
    QJsonValueRef::operator=((QJsonValueRef *)&jsonDoc,(QJsonValue *)&generator);
    QJsonValue::~QJsonValue((QJsonValue *)&generator);
    if (pcVar13 == (char *)0x0) {
      lVar18 = 0;
    }
    else {
      lVar10 = -1;
      do {
        lVar18 = lVar10 + 1;
        lVar4 = lVar10 + 1;
        lVar10 = lVar18;
      } while (pcVar13[lVar4] != '\0');
    }
    s.m_size = lVar18;
    s.m_data = pcVar13;
    QJsonValue::QJsonValue((QJsonValue *)&generator,s);
    key_00.m_size = 9;
    key_00.m_data = "inputFile";
    _jsonDoc = (QStringBuilder<const_QByteArray_&,_char>)QJsonObject::operator[](&mocData,key_00);
    QJsonValueRef::operator=((QJsonValueRef *)&jsonDoc,(QJsonValue *)&generator);
    QJsonValue::~QJsonValue((QJsonValue *)&generator);
    classesJsonFormatted.a.d.ptr =
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray(&classesJsonFormatted);
    lVar18 = (this->classList).d.size;
    if (lVar18 != 0) {
      lVar18 = lVar18 * 0x1a8;
      do {
        ClassDef::toJson((ClassDef *)&jsonDoc);
        QJsonValue::QJsonValue((QJsonValue *)&generator,(QJsonObject *)&jsonDoc);
        QJsonArray::append(&classesJsonFormatted,(QJsonValue *)&generator);
        QJsonValue::~QJsonValue((QJsonValue *)&generator);
        QJsonObject::~QJsonObject((QJsonObject *)&jsonDoc);
        lVar18 = lVar18 + -0x1a8;
      } while (lVar18 != 0);
    }
    bVar7 = QJsonArray::isEmpty(&classesJsonFormatted);
    if (!bVar7) {
      QJsonValue::QJsonValue((QJsonValue *)&generator,&classesJsonFormatted);
      key_01.m_size = 7;
      key_01.m_data = "classes";
      _jsonDoc = (QStringBuilder<const_QByteArray_&,_char>)QJsonObject::operator[](&mocData,key_01);
      QJsonValueRef::operator=((QJsonValueRef *)&jsonDoc,(QJsonValue *)&generator);
      QJsonValue::~QJsonValue((QJsonValue *)&generator);
    }
    jsonDoc.d._M_t.
    super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
    super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
         (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
         (__uniq_ptr_data<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>,_true,_true>
          )&DAT_aaaaaaaaaaaaaaaa;
    QJsonDocument::QJsonDocument(&jsonDoc,&mocData);
    QJsonDocument::toJson((QByteArray *)&generator,&jsonDoc,Indented);
    pFVar14 = generator.out;
    if (generator.out == (FILE *)0x0) {
      pFVar14 = (FILE *)"";
    }
    fputs((char *)pFVar14,(FILE *)jsonOutput);
    if (generator.parser != (Moc *)0x0) {
      LOCK();
      *(int *)&((generator.parser)->super_Parser).symbols.d.d =
           *(int *)&((generator.parser)->super_Parser).symbols.d.d + -1;
      UNLOCK();
      if (*(int *)&((generator.parser)->super_Parser).symbols.d.d == 0) {
        QArrayData::deallocate((QArrayData *)generator.parser,1,0x10);
      }
    }
    QJsonDocument::~QJsonDocument(&jsonDoc);
    QJsonArray::~QJsonArray(&classesJsonFormatted);
    QJsonObject::~QJsonObject(&mocData);
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Moc::generate(FILE *out, FILE *jsonOutput)
{
    QByteArrayView fn = strippedFileName();

    fprintf(out, "/****************************************************************************\n"
            "** Meta object code from reading C++ file '%s'\n**\n" , fn.constData());
    fprintf(out, "** Created by: The Qt Meta Object Compiler version %d (Qt %s)\n**\n" , mocOutputRevision, QT_VERSION_STR);
    fprintf(out, "** WARNING! All changes made in this file will be lost!\n"
            "*****************************************************************************/\n\n");

    // include header(s) of user class definitions at _first_ to allow
    // for preprocessor definitions possibly affecting standard headers.
    // see https://codereview.qt-project.org/c/qt/qtbase/+/445937
    if (!noInclude) {
        if (includePath.size() && !includePath.endsWith('/'))
            includePath += '/';
        for (QByteArray inc : std::as_const(includeFiles)) {
            if (!inc.isEmpty() && inc.at(0) != '<' && inc.at(0) != '"') {
                if (includePath.size() && includePath != "./")
                    inc.prepend(includePath);
                inc = '\"' + inc + '\"';
            }
            fprintf(out, "#include %s\n", inc.constData());
        }
    }
    if (classList.size() && classList.constFirst().classname == "Qt")
        fprintf(out, "#include <QtCore/qobject.h>\n");

    fprintf(out, "#include <QtCore/qmetatype.h>\n");  // For QMetaType::Type
    if (mustIncludeQPluginH)
        fprintf(out, "#include <QtCore/qplugin.h>\n");

    const auto qtContainers = requiredQtContainers(classList);
    for (const QByteArray &qtContainer : qtContainers)
        fprintf(out, "#include <QtCore/%s>\n", qtContainer.constData());

    fprintf(out, "\n#include <QtCore/qtmochelpers.h>\n");

    fprintf(out, "\n#include <memory>\n\n");  // For std::addressof
    fprintf(out, "\n#include <QtCore/qxptype_traits.h>\n"); // is_detected

    fprintf(out, "#if !defined(Q_MOC_OUTPUT_REVISION)\n"
            "#error \"The header file '%s' doesn't include <QObject>.\"\n", fn.constData());
    fprintf(out, "#elif Q_MOC_OUTPUT_REVISION != %d\n", mocOutputRevision);
    fprintf(out, "#error \"This file was generated using the moc from %s."
            " It\"\n#error \"cannot be used with the include files from"
            " this version of Qt.\"\n#error \"(The moc has changed too"
            " much.)\"\n", QT_VERSION_STR);
    fprintf(out, "#endif\n\n");

#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0)
    fprintf(out, "#ifndef Q_CONSTINIT\n"
            "#define Q_CONSTINIT\n"
            "#endif\n\n");
#endif

    fprintf(out, "QT_WARNING_PUSH\n");
    fprintf(out, "QT_WARNING_DISABLE_DEPRECATED\n");
    fprintf(out, "QT_WARNING_DISABLE_GCC(\"-Wuseless-cast\")\n");

    fputs("", out);
    for (ClassDef &def : classList) {
        Generator generator(this, &def, metaTypes, knownQObjectClasses, knownGadgets, out,
                            requireCompleteTypes);
        generator.generateCode();

        // generator.generateCode() should have already registered all strings
        if (Q_UNLIKELY(generator.registeredStringsCount() >= std::numeric_limits<int>::max())) {
            error("internal limit exceeded: number of parsed strings is too big.");
            exit(EXIT_FAILURE);
        }
    }
    fputs("", out);

    fprintf(out, "QT_WARNING_POP\n");

    if (jsonOutput) {
        QJsonObject mocData;
        mocData["outputRevision"_L1] = mocOutputRevision;
        mocData["inputFile"_L1] = QLatin1StringView(fn.constData());

        QJsonArray classesJsonFormatted;

        for (const ClassDef &cdef: std::as_const(classList))
            classesJsonFormatted.append(cdef.toJson());

        if (!classesJsonFormatted.isEmpty())
            mocData["classes"_L1] = classesJsonFormatted;

        QJsonDocument jsonDoc(mocData);
        fputs(jsonDoc.toJson().constData(), jsonOutput);
    }
}